

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpagelayout.cpp
# Opt level: O3

qreal qt_pointMultiplier(Unit unit)

{
  if (unit < (Didot|Inch)) {
    return *(qreal *)(&DAT_0069ada0 + (ulong)unit * 8);
  }
  return 1.0;
}

Assistant:

Q_GUI_EXPORT qreal qt_pointMultiplier(QPageLayout::Unit unit)
{
    switch (unit) {
    case QPageLayout::Millimeter:
        return 2.83464566929;
    case QPageLayout::Point:
        return 1.0;
    case QPageLayout::Inch:
        return 72.0;
    case QPageLayout::Pica:
        return 12;
    case QPageLayout::Didot:
        return 1.065826771;
    case QPageLayout::Cicero:
        return 12.789921252;
    }
    return 1.0;
}